

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O0

shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
__thiscall
FIX::shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::create(shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,size_t nSize)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *storage;
  size_t sizeToAllocate;
  size_t nSize_local;
  
  if (nSize == 0) {
    shared_array(this);
    pbVar5 = extraout_RDX;
  }
  else {
    uVar2 = nSize + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
    uVar6 = uVar3 + 8;
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar6);
    *puVar4 = uVar2;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar4 + 1);
    if (uVar2 != 0) {
      local_50 = pbVar5;
      do {
        std::__cxx11::string::string((string *)local_50);
        local_50 = local_50 + 1;
      } while (local_50 != pbVar5 + uVar2);
    }
    memset(pbVar5,0,uVar2 * 0x20);
    std::atomic<long>::atomic((atomic<long> *)pbVar5,1);
    shared_array(this,pbVar5,nSize);
    pbVar5 = extraout_RDX_00;
  }
  sVar7.m_buffer = pbVar5;
  sVar7.m_size = (size_t)this;
  return sVar7;
}

Assistant:

static shared_array create(const std::size_t nSize) {
    if (nSize == 0) {
      return shared_array();
    }

    // verify the needed buffer size to allocate counter object and nSize elements
    const std::size_t sizeToAllocate = data_offset + nSize;

    // allocate and zero-fill the buffer
    T *storage = new T[sizeToAllocate];
    memset(reinterpret_cast<void *>(storage), 0, sizeToAllocate * sizeof(T));

    // create the counter object at the end of the storage
    // with initial reference count set to 1
    new (storage) std::atomic<long>(1);

    return shared_array(storage, nSize);
  }